

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O2

line * lalloc(int used)

{
  int iVar1;
  line *lp;
  
  lp = (line *)malloc(0x20);
  if (lp != (line *)0x0) {
    lp->l_text = (char *)0x0;
    lp->l_size = 0;
    lp->l_used = used;
    iVar1 = lrealloc(lp,used);
    if (iVar1 != 0) {
      return lp;
    }
    free(lp);
  }
  return (line *)0x0;
}

Assistant:

struct line *
lalloc(int used)
{
	struct line *lp;

	if ((lp = malloc(sizeof(*lp))) == NULL)
		return (NULL);
	lp->l_text = NULL;
	lp->l_size = 0;
	lp->l_used = used;	/* XXX */
	if (lrealloc(lp, used) == FALSE) {
		free(lp);
		return (NULL);
	}
	return (lp);
}